

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UESS.h
# Opt level: O1

Estimates * UESS(Estimates *__return_storage_ptr__,CGraph *cg,Parameters *params)

{
  double dVar1;
  double dVar2;
  Parameters params_00;
  CGraph g;
  pointer pOVar3;
  CGraph *pCVar4;
  Estimates *pEVar5;
  uint uVar6;
  ulong *puVar7;
  size_t __i;
  long lVar8;
  vector<long,_std::allocator<long>_> *__x;
  ulong *puVar9;
  int iVar10;
  ulong uVar11;
  pointer pOVar12;
  byte bVar13;
  vector<long,_std::allocator<long>_> dsts;
  vector<long,_std::allocator<long>_> srcs;
  OrderedEdgeCollection randomEdgeCollection;
  CGraph CG_p;
  Estimates triangles_in_Gp;
  random_device rd;
  mt19937 mt;
  ulong in_stack_ffffffffffffc278;
  undefined8 in_stack_ffffffffffffc280;
  undefined8 in_stack_ffffffffffffc288;
  undefined8 in_stack_ffffffffffffc290;
  VertexIdx *in_stack_ffffffffffffc298;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 in_stack_ffffffffffffc2a0 [128];
  vector<long,_std::allocator<long>_> local_29f8;
  vector<long,_std::allocator<long>_> local_29d8;
  double local_29b8;
  vector<OrderedEdge,_std::allocator<OrderedEdge>_> local_29b0;
  vector<bool,_std::allocator<bool>_> vStack_2998;
  vector<bool,_std::allocator<bool>_> vStack_2970;
  long lStack_2948;
  CGraph *local_2940;
  Estimates local_2938;
  ulong *local_2918;
  undefined4 uStack_2910;
  undefined4 uStack_290c;
  ulong *local_2908;
  undefined4 uStack_2900;
  undefined4 uStack_28fc;
  _Bit_pointer local_28f8;
  ulong *local_28f0;
  undefined4 uStack_28e8;
  undefined4 uStack_28e4;
  ulong *local_28e0;
  undefined4 uStack_28d8;
  undefined4 uStack_28d4;
  _Bit_pointer local_28d0;
  long local_28c8;
  Estimates *local_28b8;
  vector<long,_std::allocator<long>_> local_28b0;
  vector<long,_std::allocator<long>_> local_2898;
  OrderedEdgeCollection local_2880;
  Estimates local_2808;
  Parameters local_27e8;
  random_device local_2740;
  ulong local_13b8 [624];
  undefined8 local_38;
  
  bVar13 = 0;
  vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ =
       vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
  vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ =
       vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
  local_29b0.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_29b0.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_29b0.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
  vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ =
       vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
  vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  lStack_2948 = 0;
  std::random_device::random_device(&local_2740);
  uVar6 = std::random_device::_M_getval();
  uVar11 = (ulong)uVar6;
  local_13b8[0] = uVar11;
  lVar8 = 1;
  do {
    uVar11 = (ulong)(((uint)(uVar11 >> 0x1e) ^ (uint)uVar11) * 0x6c078965 + (int)lVar8);
    local_13b8[lVar8] = uVar11;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0x270);
  local_38 = 0x270;
  puVar7 = local_13b8;
  puVar9 = (ulong *)&stack0xffffffffffffc278;
  for (lVar8 = 0x271; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar9 = *puVar7;
    puVar7 = puVar7 + (ulong)bVar13 * -2 + 1;
    puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
  }
  GetEdgesByUniSampling(&local_2938,cg,params);
  pOVar12 = local_29b0.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  pOVar3 = local_29b0.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar10 = (int)lVar8;
  local_29b8 = local_2938.estimate;
  local_29b0.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_2938.fraction_of_vertices_seen;
  local_29b0.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_2938.fraction_of_edges_seen;
  local_29b0.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_2938.query_complexity;
  local_2938.fraction_of_vertices_seen = 0.0;
  local_2938.fraction_of_edges_seen = 0.0;
  local_2938.query_complexity = 0.0;
  local_28b8 = __return_storage_ptr__;
  if (pOVar3 != (pointer)0x0) {
    operator_delete(pOVar3,(long)pOVar12 - (long)pOVar3);
  }
  local_2940 = cg;
  if (vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = local_28f8;
  vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = CONCAT44(uStack_290c,uStack_2910);
  vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = CONCAT44(uStack_28fc,uStack_2900);
  vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = local_2908;
  vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = local_2918;
  local_2918 = (ulong *)0x0;
  uStack_2910 = 0;
  local_2908 = (ulong *)0x0;
  uStack_2900 = 0;
  local_28f8 = (_Bit_pointer)0x0;
  if (vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = local_28d0;
  vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._8_8_ = CONCAT44(uStack_28e4,uStack_28e8);
  vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._8_8_ = CONCAT44(uStack_28d4,uStack_28d8);
  vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = local_28e0;
  vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = local_28f0;
  local_28f0 = (ulong *)0x0;
  uStack_28e8 = 0;
  local_28e0 = (ulong *)0x0;
  uStack_28d8 = 0;
  local_28d0 = (_Bit_pointer)0x0;
  lStack_2948 = local_28c8;
  if (local_2918 != (ulong *)0x0) {
    operator_delete(local_2918,(long)local_28f8 - (long)local_2918);
    local_2918 = (ulong *)0x0;
    uStack_2910 = 0;
    local_2908 = (ulong *)0x0;
    uStack_2900 = 0;
    local_28f8 = (_Bit_pointer)0x0;
  }
  if ((void *)local_2938.fraction_of_vertices_seen != (void *)0x0) {
    operator_delete((void *)local_2938.fraction_of_vertices_seen,
                    (long)local_2938.query_complexity - (long)local_2938.fraction_of_vertices_seen);
  }
  if (params->normalization_count_available == false) {
    local_2880.no_of_edges = (EdgeIdx)local_29b8;
    std::vector<OrderedEdge,_std::allocator<OrderedEdge>_>::vector
              (&local_2880.edge_list,&local_29b0);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_2880.visited_edge_set,&vStack_2998);
    std::vector<bool,_std::allocator<bool>_>::vector(&local_2880.visited_vertex_set,&vStack_2970);
    local_2880.no_of_query = lStack_2948;
    Parameters::Parameters(&local_27e8,params);
    params_00.filename._M_string_length = in_stack_ffffffffffffc280;
    params_00.filename._M_dataplus._M_p = (pointer)in_stack_ffffffffffffc278;
    params_00.filename.field_2._M_allocated_capacity = in_stack_ffffffffffffc288;
    params_00.filename.field_2._8_8_ = in_stack_ffffffffffffc290;
    params_00.seed_count = (VertexIdx)in_stack_ffffffffffffc298;
    auVar14 = in_stack_ffffffffffffc2a0._56_32_;
    auVar15 = in_stack_ffffffffffffc2a0._88_32_;
    params_00.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
    super__Vector_impl_data =
         (_Vector_base<long,_std::allocator<long>_>)
         (_Vector_base<long,_std::allocator<long>_>)in_stack_ffffffffffffc2a0._0_24_;
    params_00.walk_length = in_stack_ffffffffffffc2a0._24_8_;
    params_00.subsample_size = in_stack_ffffffffffffc2a0._32_8_;
    params_00.no_of_repeat = in_stack_ffffffffffffc2a0._40_4_;
    params_00._84_4_ = in_stack_ffffffffffffc2a0._44_4_;
    params_00.sparsification_prob = (double)in_stack_ffffffffffffc2a0._48_8_;
    params_00.algo_name._M_dataplus._M_p = (pointer)auVar14._0_8_;
    params_00.algo_name._M_string_length = auVar14._8_8_;
    params_00.algo_name.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )auVar14._16_16_;
    params_00.out_directory._M_dataplus._M_p = (pointer)auVar15._0_8_;
    params_00.out_directory._M_string_length = auVar15._8_8_;
    params_00.out_directory.field_2 =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          )auVar15._16_16_;
    params_00.print_to_console = (bool)in_stack_ffffffffffffc2a0[0x78];
    params_00.print_to_file = (bool)in_stack_ffffffffffffc2a0[0x79];
    params_00.normalization_count_available = (bool)in_stack_ffffffffffffc2a0[0x7a];
    params_00.CSS = (bool)in_stack_ffffffffffffc2a0[0x7b];
    params_00.NB = (bool)in_stack_ffffffffffffc2a0[0x7c];
    params_00._165_3_ = in_stack_ffffffffffffc2a0._125_3_;
    EstimateEdgeCount(&local_2938,local_2940,&local_2880,params_00,iVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_27e8.out_directory._M_dataplus._M_p != &local_27e8.out_directory.field_2) {
      operator_delete(local_27e8.out_directory._M_dataplus._M_p,
                      local_27e8.out_directory.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_27e8.algo_name._M_dataplus._M_p != &local_27e8.algo_name.field_2) {
      operator_delete(local_27e8.algo_name._M_dataplus._M_p,
                      local_27e8.algo_name.field_2._M_allocated_capacity + 1);
    }
    if (local_27e8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_27e8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_27e8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_27e8.seed_vertices.super__Vector_base<long,_std::allocator<long>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_27e8.filename._M_dataplus._M_p != &local_27e8.filename.field_2) {
      operator_delete(local_27e8.filename._M_dataplus._M_p,
                      local_27e8.filename.field_2._M_allocated_capacity + 1);
    }
    if (local_2880.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_2880.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_2880.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>
                            ._M_impl.super__Bvector_impl_data._M_end_of_storage -
                      (long)local_2880.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>
                            ._M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                     );
      local_2880.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_2880.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_2880.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_2880.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_2880.visited_vertex_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_2880.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_2880.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl
                      .super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_2880.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_end_of_storage -
                      (long)local_2880.visited_edge_set.super__Bvector_base<std::allocator<bool>_>.
                            _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p)
      ;
      local_2880.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_2880.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      local_2880.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      local_2880.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      local_2880.visited_edge_set.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
    }
    if (local_2880.edge_list.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2880.edge_list.
                      super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2880.edge_list.
                            super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2880.edge_list.
                            super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  pOVar3 = local_29b0.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (long *)0x0;
  local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (long *)0x0;
  local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (long *)0x0;
  local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (long *)0x0;
  if (local_29b0.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_29b0.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pOVar12 = local_29b0.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_2938.estimate = (double)pOVar12->u;
      local_2938.fraction_of_vertices_seen = (double)pOVar12->v;
      local_2938.fraction_of_edges_seen = (double)pOVar12->index;
      local_2938.query_complexity = (double)pOVar12->degree;
      if (local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
          ._M_finish ==
          local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long&>
                  ((vector<long,std::allocator<long>> *)&local_29d8,
                   (iterator)
                   local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)&local_2938);
      }
      else {
        *local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = (long)local_2938.estimate;
        local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
          ._M_finish ==
          local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long&>
                  ((vector<long,std::allocator<long>> *)&local_29f8,
                   (iterator)
                   local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)&local_2938.fraction_of_vertices_seen);
      }
      else {
        *local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = (long)local_2938.fraction_of_vertices_seen;
        local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
          ._M_finish ==
          local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long&>
                  ((vector<long,std::allocator<long>> *)&local_29d8,
                   (iterator)
                   local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)&local_2938.fraction_of_vertices_seen);
      }
      else {
        *local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = (long)local_2938.fraction_of_vertices_seen;
        local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
          ._M_finish ==
          local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long&>
                  ((vector<long,std::allocator<long>> *)&local_29f8,
                   (iterator)
                   local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)&local_2938);
      }
      else {
        *local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = (long)local_2938.estimate;
        local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      pOVar12 = pOVar12 + 1;
    } while (pOVar12 != pOVar3);
  }
  std::vector<long,_std::allocator<long>_>::vector(&local_2898,&local_29d8);
  __x = &local_29f8;
  std::vector<long,_std::allocator<long>_>::vector(&local_28b0,__x);
  pEVar5 = local_28b8;
  pCVar4 = local_2940;
  MakeMultiGraph((CGraph *)&local_2938,(VertexIdx)__x,&local_2898,&local_28b0);
  if (local_28b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28b0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_2898.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2898.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2898.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2898.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  CountExactTriangles(&local_2808,(CGraph *)&local_2938);
  g.nEdges = (EdgeIdx)local_2938.fraction_of_edges_seen;
  g.nVertices = (VertexIdx)local_2938.fraction_of_vertices_seen;
  g.offsets = (EdgeIdx *)local_2938.query_complexity;
  g.nbors = in_stack_ffffffffffffc298;
  Escape::delCGraph(g);
  dVar1 = pow(((double)(long)local_29b8 + (double)(long)local_29b8) / (double)pCVar4->nEdges,3.0);
  pEVar5->fraction_of_vertices_seen = 1.0;
  pEVar5->fraction_of_edges_seen = 1.0;
  pEVar5->query_complexity = 1.0;
  pEVar5->estimate = (1.0 / dVar1) * local_2808.estimate;
  dVar2 = 0.0;
  dVar1 = 0.0;
  if (vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset != 0 ||
      vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p !=
      vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p) {
    lVar8 = 0;
    uVar11 = 0;
    puVar7 = vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p;
    do {
      lVar8 = lVar8 + (ulong)((*puVar7 >> (uVar11 & 0x3f) & 1) != 0);
      iVar10 = (int)uVar11;
      puVar7 = puVar7 + (iVar10 == 0x3f);
      uVar11 = (ulong)(iVar10 + 1);
      if (iVar10 == 0x3f) {
        uVar11 = 0;
      }
    } while ((uint)uVar11 !=
             vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
             ._M_finish.super__Bit_iterator_base._M_offset ||
             puVar7 != vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p);
    dVar1 = (double)lVar8 * 100.0;
  }
  if (vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset != 0 ||
      vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p !=
      vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_p) {
    lVar8 = 0;
    uVar11 = 0;
    puVar7 = vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
             ._M_start.super__Bit_iterator_base._M_p;
    do {
      lVar8 = lVar8 + (ulong)((*puVar7 >> (uVar11 & 0x3f) & 1) != 0);
      iVar10 = (int)uVar11;
      puVar7 = puVar7 + (iVar10 == 0x3f);
      uVar11 = (ulong)(iVar10 + 1);
      if (iVar10 == 0x3f) {
        uVar11 = 0;
      }
    } while ((uint)uVar11 !=
             vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
             ._M_finish.super__Bit_iterator_base._M_offset ||
             puVar7 != vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p);
    dVar2 = (double)lVar8 * 100.0;
  }
  pEVar5->fraction_of_vertices_seen = dVar2 / (double)pCVar4->nVertices;
  lVar8 = pCVar4->nEdges;
  pEVar5->fraction_of_edges_seen = dVar1 / (double)lVar8;
  pEVar5->query_complexity = ((double)lStack_2948 * 100.0) / (double)lVar8;
  if (local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_29f8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_29d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  if (vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
    .super__Bit_iterator_base._M_p = (ulong *)0x0;
    vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
    .super__Bit_iterator_base._8_8_ =
         vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (ulong *)0x0;
    vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._8_8_ =
         vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    vStack_2970.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_start.super__Bit_iterator_base._M_p != (ulong *)0x0) {
    operator_delete(vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
    .super__Bit_iterator_base._M_p = (ulong *)0x0;
    vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
    .super__Bit_iterator_base._8_8_ =
         vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_start.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (ulong *)0x0;
    vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._8_8_ =
         vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    vStack_2998.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_29b0.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_29b0.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_29b0.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_29b0.super__Vector_base<OrderedEdge,_std::allocator<OrderedEdge>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return pEVar5;
}

Assistant:

Estimates UESS(CGraph *cg, Parameters params)
{
    /**
    * Set up local variables. skip parameter is used in estimating the number of edges in the graph.
    */
    OrderedEdgeCollection randomEdgeCollection;
    double running_count = 0.0, edge_estimate=0.0;
    int skip = 1;

    /**
    * Set up random number generator
    * Using this random number generator initializize a PRNG: this PRNG is passed along to
    * draw an element from various distributions
    */
    std::random_device rd;
    std::mt19937 mt(rd());

    /**
     * Perform a random walk through the graph, and collect the edges in the process
     * The fourth parameter is set to false to indicate that we do not care about the
     * vertex ordering of each edge
     */
    randomEdgeCollection = GetEdgesByUniSampling(cg, params, mt);

    /**
     * Depending on whether the total number of edges in the graphs is available or not, compute it.
     */
    if (!params.normalization_count_available) {
        Estimates edge_count_output = EstimateEdgeCount(cg, randomEdgeCollection, params, skip);
        edge_estimate = edge_count_output.estimate;
    }
    else
        edge_estimate = cg->nEdges *1.0;

    std::vector<VertexIdx > srcs;
    std::vector<VertexIdx > dsts;

    for (auto edge : randomEdgeCollection.edge_list) {
        srcs.emplace_back(edge.u);
        dsts.emplace_back(edge.v);
        srcs.emplace_back(edge.v);  // The graph representation (adjacency list) requires both the edges to be present
        dsts.emplace_back(edge.u);
    }
    /**
     * Construct the induced graph G_p
     * Note that G_p is a multi-graph. When counting triangles exactly in G_p, we consider this multiplicity.
     */
    CGraph CG_p = MakeMultiGraph(cg->nVertices,srcs,dsts);

    /**
     * Count the exact number of triangles in the sparsified graph CG_p and scale it up.
     */

    Estimates triangles_in_Gp = CountExactTriangles(&CG_p);
    delCGraph(CG_p);
    double p = randomEdgeCollection.no_of_edges *2.0 / cg->nEdges;
    double scale = 1.0 / pow(p,3);
    double triangleEstimate = triangles_in_Gp.estimate * scale ;

    Estimates return_estimate = {};
    return_estimate.estimate = triangleEstimate;

    VertexIdx edges_seen = std::count(randomEdgeCollection.visited_edge_set.begin(),randomEdgeCollection.visited_edge_set.end(),true);
    VertexIdx vertices_seen = std::count(randomEdgeCollection.visited_vertex_set.begin(),randomEdgeCollection.visited_vertex_set.end(), true);

    return_estimate.fraction_of_vertices_seen = vertices_seen * 100.0 / cg->nVertices;
    return_estimate.fraction_of_edges_seen = edges_seen * 100.0 / cg->nEdges;
    return_estimate.query_complexity = randomEdgeCollection.no_of_query * 100.0 /cg->nEdges;

    return return_estimate;
}